

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments.cxx
# Opt level: O0

int argument(char *arg,char *value,void *call_data)

{
  ostream *poVar1;
  bool bVar2;
  char *local_38;
  void *call_data_local;
  char *value_local;
  char *arg_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Got argument: \"");
  poVar1 = std::operator<<(poVar1,arg);
  poVar1 = std::operator<<(poVar1,"\" value: \"");
  local_38 = value;
  if (value == (char *)0x0) {
    local_38 = "(null)";
  }
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"\"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  bVar2 = call_data == random_ptr;
  if (!bVar2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Problem processing call_data");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  arg_local._4_4_ = (uint)bVar2;
  return arg_local._4_4_;
}

Assistant:

static int argument(const char* arg, const char* value, void* call_data)
{
  std::cout << "Got argument: \"" << arg << "\" value: \"" << (value?value:"(null)") << "\"" << std::endl;
  if ( call_data != random_ptr )
    {
    std::cerr << "Problem processing call_data" << std::endl;
    return 0;
    }
  return 1;
}